

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramSetResetPointers(VP8LHistogramSet *set,int cache_bits)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long in_RDI;
  uint8_t *memory;
  int histo_size;
  int i;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 local_10;
  
  iVar1 = VP8LGetHistogramSize((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  lVar2 = (long)*(int *)(in_RDI + 4) * 8 + *(long *)(in_RDI + 8);
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 4); local_10 = local_10 + 1) {
    uVar3 = lVar2 + 0x1fU & 0xffffffffffffffe0;
    *(ulong *)(*(long *)(in_RDI + 8) + (long)local_10 * 8) = uVar3;
    **(long **)(*(long *)(in_RDI + 8) + (long)local_10 * 8) = uVar3 + 0xcd8;
    lVar2 = uVar3 + (long)iVar1;
  }
  return;
}

Assistant:

static void HistogramSetResetPointers(VP8LHistogramSet* const set,
                                      int cache_bits) {
  int i;
  const int histo_size = VP8LGetHistogramSize(cache_bits);
  uint8_t* memory = (uint8_t*) (set->histograms);
  memory += set->max_size * sizeof(*set->histograms);
  for (i = 0; i < set->max_size; ++i) {
    memory = (uint8_t*) WEBP_ALIGN(memory);
    set->histograms[i] = (VP8LHistogram*) memory;
    // literal_ won't necessary be aligned.
    set->histograms[i]->literal_ = (uint32_t*)(memory + sizeof(VP8LHistogram));
    memory += histo_size;
  }
}